

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing2_640x480at60_25.175MHz.c
# Opt level: O2

void vSyncLine(void)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0x29;
  do {
    putchar(5);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(1);
  }
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    putchar(5);
  }
  return;
}

Assistant:

void vSyncLine() {

    // Blanking
    for(int i=0;i<(640/16);i++) {
        putchar(0b00000101);
    }

    // Front Porch
    for(int i=0; i<(16/16); i++) {
        putchar(0b00000101);
    }

    // hSync
    for(int i=0;i<(96/16);i++) {
        putchar(0b00000001);
    }

    // Back Porch
    for(int i=0; i<(48/16); i++) {
        putchar(0b00000101);
    }

}